

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,long,duckdb::BinaryStandardOperatorWrapper,duckdb::InstrOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,long *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  string_t haystack;
  string_t haystack_00;
  string_t haystack_01;
  string_t needle;
  string_t needle_00;
  string_t needle_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar2 = 0;
    while (bVar11 = count != 0, count = count - 1, bVar11) {
      haystack_01.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + lVar2 * 2 + 8);
      haystack_01.value._0_8_ = *(undefined8 *)((long)&ldata->value + lVar2 * 2);
      needle_01.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + lVar2 * 2 + 8);
      needle_01.value._0_8_ = *(undefined8 *)((long)&rdata->value + lVar2 * 2);
      lVar4 = InstrOperator::Operation<duckdb::string_t,duckdb::string_t,long>
                        (haystack_01,needle_01);
      *(long *)((long)result_data + lVar2) = lVar4;
      lVar2 = lVar2 + 8;
    }
  }
  else {
    uVar8 = 0;
    for (uVar5 = 0; uVar5 != count + 0x3f >> 6; uVar5 = uVar5 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
LAB_007c60fb:
        uVar6 = uVar8 << 4 | 8;
        for (; uVar3 = uVar8, uVar8 < uVar9; uVar8 = uVar8 + 1) {
          haystack.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar6);
          haystack.value._0_8_ = *(undefined8 *)((long)ldata + (uVar6 - 8));
          needle.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + uVar6);
          needle.value._0_8_ = *(undefined8 *)((long)rdata + (uVar6 - 8));
          lVar2 = InstrOperator::Operation<duckdb::string_t,duckdb::string_t,long>(haystack,needle);
          result_data[uVar8] = lVar2;
          uVar6 = uVar6 + 0x10;
        }
      }
      else {
        uVar6 = puVar1[uVar5];
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
        if (uVar6 == 0xffffffffffffffff) goto LAB_007c60fb;
        uVar3 = uVar9;
        if (uVar6 != 0) {
          uVar10 = uVar8 << 4 | 8;
          for (uVar7 = 0; uVar3 = uVar7 + uVar8, uVar7 + uVar8 < uVar9; uVar7 = uVar7 + 1) {
            if ((uVar6 >> (uVar7 & 0x3f) & 1) != 0) {
              haystack_00.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar10);
              haystack_00.value._0_8_ = *(undefined8 *)((long)ldata + (uVar10 - 8));
              needle_00.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + uVar10);
              needle_00.value._0_8_ = *(undefined8 *)((long)rdata + (uVar10 - 8));
              lVar2 = InstrOperator::Operation<duckdb::string_t,duckdb::string_t,long>
                                (haystack_00,needle_00);
              result_data[uVar8 + uVar7] = lVar2;
            }
            uVar10 = uVar10 + 0x10;
          }
        }
      }
      uVar8 = uVar3;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}